

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::GetIntConstant<unsigned_int>
          (InstructionBuilder *this,uint value,bool sign)

{
  uint32_t id;
  TypeManager *pTVar1;
  Type *type;
  ConstantManager *pCVar2;
  Constant *c;
  Instruction *pIVar3;
  Integer int_type;
  uint local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  Type local_58;
  undefined1 local_30;
  
  local_58.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.kind_ = kInteger;
  local_58._36_4_ = 0x20;
  local_58._vptr_Type = (_func_int **)&PTR__Type_00a6c948;
  local_30 = sign;
  pTVar1 = IRContext::get_type_mgr(this->context_);
  id = analysis::TypeManager::GetTypeInstruction(pTVar1,&local_58);
  if (id == 0) {
    pIVar3 = (Instruction *)0x0;
  }
  else {
    pTVar1 = IRContext::get_type_mgr(this->context_);
    type = analysis::TypeManager::GetType(pTVar1,id);
    pCVar2 = IRContext::get_constant_mgr(this->context_);
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    local_7c = value;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,&local_7c);
    c = analysis::ConstantManager::GetConstant
                  (pCVar2,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
    pCVar2 = IRContext::get_constant_mgr(this->context_);
    pIVar3 = analysis::ConstantManager::GetDefiningInstruction(pCVar2,c,0,(inst_iterator *)0x0);
  }
  analysis::Type::~Type(&local_58);
  return pIVar3;
}

Assistant:

Instruction* GetIntConstant(T value, bool sign) {
    // Assert that we are not trying to store a negative number in an unsigned
    // type.
    if (!sign)
      assert(value >= 0 &&
             "Trying to add a signed integer with an unsigned type!");

    analysis::Integer int_type{32, sign};

    // Get or create the integer type. This rebuilds the type and manages the
    // memory for the rebuilt type.
    uint32_t type_id =
        GetContext()->get_type_mgr()->GetTypeInstruction(&int_type);

    if (type_id == 0) {
      return nullptr;
    }

    // Get the memory managed type so that it is safe to be stored by
    // GetConstant.
    analysis::Type* rebuilt_type =
        GetContext()->get_type_mgr()->GetType(type_id);

    // Even if the value is negative we need to pass the bit pattern as a
    // uint32_t to GetConstant.
    uint32_t word = value;

    // Create the constant value.
    const analysis::Constant* constant =
        GetContext()->get_constant_mgr()->GetConstant(rebuilt_type, {word});

    // Create the OpConstant instruction using the type and the value.
    return GetContext()->get_constant_mgr()->GetDefiningInstruction(constant);
  }